

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceBuffer * __thiscall
slang::SourceManager::cacheBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,path *path,
          SourceLocation includedFrom,vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  ulong uVar2;
  type *this_00;
  type_conflict2 *ptVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>
  *ppVar4;
  pointer fd_00;
  pair<std::_Rb_tree_const_iterator<std::filesystem::__cxx11::path>,_bool> pVar5;
  pair<_3562ccc5_> pVar6;
  FileData *fdPtr;
  type_conflict2 *inserted;
  type *it;
  string local_1a0;
  pair<_3562ccc5_> local_180;
  _Base_ptr local_170;
  undefined1 local_168;
  value_type local_160;
  _Rb_tree_const_iterator<std::filesystem::__cxx11::path> local_138;
  undefined1 local_130;
  reference local_128;
  unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
  local_120;
  __single_object fd;
  unique_lock<std::shared_mutex> lock;
  string local_e0;
  initializer_list<char> local_c0 [2];
  path local_a0;
  string local_78;
  undefined1 local_58 [8];
  error_code ec;
  string name;
  vector<char,_std::allocator<char>_> *buffer_local;
  path *path_local;
  SourceManager *this_local;
  SourceLocation includedFrom_local;
  
  std::__cxx11::string::string((string *)&ec._M_cat);
  if ((this->disableProximatePaths & 1U) == 0) {
    std::error_code::error_code((error_code *)local_58);
    std::filesystem::proximate(&local_a0,path,(error_code *)local_58);
    std::filesystem::__cxx11::path::u8string(&local_78,&local_a0);
    std::__cxx11::string::operator=((string *)&ec._M_cat,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::filesystem::__cxx11::path::~path(&local_a0);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_58);
    if (bVar1) {
      std::initializer_list<char>::initializer_list(local_c0);
      std::__cxx11::string::operator=((string *)&ec._M_cat,local_c0[0]._M_array,local_c0[0]._M_len);
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::filesystem::__cxx11::path::filename((path *)&lock._M_owns,path);
    std::filesystem::__cxx11::path::u8string(&local_e0,(path *)&lock._M_owns);
    std::__cxx11::string::operator=((string *)&ec._M_cat,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::filesystem::__cxx11::path::~path((path *)&lock._M_owns);
  }
  std::unique_lock<std::shared_mutex>::unique_lock((unique_lock<std::shared_mutex> *)&fd,&this->mut)
  ;
  std::filesystem::__cxx11::path::parent_path();
  pVar5 = std::
          set<std::filesystem::__cxx11::path,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          ::insert(&this->directories,&local_160);
  local_170 = (_Base_ptr)pVar5.first._M_node;
  local_168 = pVar5.second;
  local_138._M_node = local_170;
  local_130 = local_168;
  local_128 = std::_Rb_tree_const_iterator<std::filesystem::__cxx11::path>::operator*(&local_138);
  std::
  make_unique<slang::SourceManager::FileData,std::filesystem::__cxx11::path_const*,std::__cxx11::string,std::vector<char,std::allocator<char>>>
            ((path **)&local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
             (vector<char,_std::allocator<char>_> *)&ec._M_cat);
  std::filesystem::__cxx11::path::~path(&local_160);
  std::filesystem::__cxx11::path::u8string(&local_1a0,path);
  pVar6 = ska::detailv3::
          sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
          ::
          emplace<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>
                    ((sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                      *)&this->lookupCache,&local_1a0,&local_120);
  local_180.first = pVar6.first.current;
  local_180.second = pVar6.second;
  std::__cxx11::string::~string((string *)&local_1a0);
  this_00 = std::
            get<0ul,ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>::templated_iterator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,bool>
                      (&local_180);
  ptVar3 = std::
           get<1ul,ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>::templated_iterator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,bool>
                     (&local_180);
  if ((*ptVar3 & 1U) != 0) {
    ppVar4 = ska::detailv3::
             sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
             ::
             templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>
             ::operator->(this_00);
    fd_00 = std::
            unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
            ::get(&ppVar4->second);
    createBufferEntry(__return_storage_ptr__,this,fd_00,includedFrom,
                      (unique_lock<std::shared_mutex> *)&fd);
    std::
    unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
    ::~unique_ptr(&local_120);
    std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)&fd);
    std::__cxx11::string::~string((string *)&ec._M_cat);
    return __return_storage_ptr__;
  }
  assert::assertFailed
            ("inserted",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
             ,0x21b,
             "SourceBuffer slang::SourceManager::cacheBuffer(const fs::path &, SourceLocation, std::vector<char> &&)"
            );
}

Assistant:

SourceBuffer SourceManager::cacheBuffer(const fs::path& path, SourceLocation includedFrom,
                                        std::vector<char>&& buffer) {
    std::string name;
    if (!disableProximatePaths) {
        std::error_code ec;
        name = fs::proximate(path, ec).u8string();
        if (ec)
            name = {};
    }

    if (name.empty())
        name = path.filename().u8string();

    std::unique_lock lock(mut);

    auto fd = std::make_unique<FileData>(&*directories.insert(path.parent_path()).first,
                                         std::move(name), std::move(buffer));

    auto [it, inserted] = lookupCache.emplace(path.u8string(), std::move(fd));
    ASSERT(inserted);

    FileData* fdPtr = it->second.get();
    return createBufferEntry(fdPtr, includedFrom, lock);
}